

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

bool __thiscall MathInterpreter::isVariable(MathInterpreter *this,string *s)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  if ((cVar1 < '{') && ('`' < cVar1 || (byte)(cVar1 + 0xbfU) < 0x1a)) {
    for (uVar3 = 1;
        (uVar4 = (ulong)uVar3, uVar4 < s->_M_string_length && (cVar1 = pcVar2[uVar4], cVar1 < '{'));
        uVar3 = uVar3 + 1) {
      if (cVar1 < 'a') {
        if (cVar1 < '[') {
          if (9 < (byte)(cVar1 - 0x30U) && cVar1 < 'A') break;
        }
        else if (cVar1 != '_') break;
      }
    }
    if (s->_M_string_length == uVar4) {
      return true;
    }
  }
  return false;
}

Assistant:

bool MathInterpreter::isVariable(string s) {
  unsigned int i = 0;
  std::size_t size = s.size();
  if (((s[i] <= 'z') && (s[i] >= 'a')) || ((s[i] <= 'Z') && (s[i] >= 'A'))) {
    i++;
    while (i < size && (((s[i] <= 'z') && (s[i] >= 'a'))
        || ((s[i] <= 'Z') && (s[i] >= 'A')) || (s[i] == '_')
        || ((s[i] <= '9') && (s[i] >= '0')))) {
      i++;
    }
    if (i == size) {
      return true;
    }
  }
  return false;
}